

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O3

pair<int,_float> * __thiscall
directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>::
get_data<directed_flag_complex_boundary_cell_t>
          (directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *this,int dimension,
          directed_flag_complex_boundary_cell_t *vertices,int offset)

{
  map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
  *pmVar1;
  undefined2 uVar2;
  int iVar3;
  pair<int,_float> *ppVar4;
  runtime_error *this_00;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  bool bVar8;
  directed_flag_complex_boundary_cell_t local_40;
  
  if (dimension == 0) {
    return &this->data;
  }
  pmVar1 = this->children;
  if (pmVar1 == (map<unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>_>
                 *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"A cell could not be found in the directed flag complex.");
  }
  else {
    iVar3 = (**(vertices->super_directed_flag_complex_cell_t)._vptr_directed_flag_complex_cell_t)
                      (vertices,(long)(offset + 1));
    p_Var5 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var7 = &(pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header;
    p_Var6 = p_Var7;
    if (p_Var5 != (_Base_ptr)0x0) {
      do {
        uVar2 = (undefined2)iVar3;
        bVar8 = (ushort)(short)p_Var5[1]._M_color < (ushort)uVar2;
        if (!bVar8) {
          p_Var6 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[bVar8];
      } while (p_Var5 != (_Base_ptr)0x0);
      if ((p_Var6 != p_Var7) && ((ushort)(short)p_Var6[1]._M_color <= (ushort)uVar2)) {
        p_Var7 = p_Var6;
      }
    }
    if ((_Rb_tree_header *)p_Var7 != &(this->children->_M_t)._M_impl.super__Rb_tree_header) {
      local_40.super_directed_flag_complex_cell_t.vertices =
           (vertices->super_directed_flag_complex_cell_t).vertices;
      local_40.super_directed_flag_complex_cell_t._vptr_directed_flag_complex_cell_t =
           (_func_int **)&PTR_vertex_0014e2a0;
      local_40.i = vertices->i;
      ppVar4 = get_data<directed_flag_complex_boundary_cell_t>
                         ((directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_> *)
                          &p_Var7[1]._M_parent,dimension + -1,&local_40,offset + 1);
      return ppVar4;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"A cell could not be found in the directed flag complex.");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const ExtraData& get_data(int dimension, const Cell vertices, int offset = 0) const {
		if (dimension == 0) return data;

		if (children == nullptr) {
			throw std::runtime_error("A cell could not be found in the directed flag complex.");
		}

		offset++;
		auto pair = children->find(vertices[offset]);
		if (pair == children->end()) {
			throw std::runtime_error("A cell could not be found in the directed flag complex.");
		}

		return pair->second.get_data(dimension - 1, vertices, offset);
	}